

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

string * flatbuffers::TSGRPCGenerator::GeneratedFileName
                   (string *__return_storage_ptr__,string *path,string *file_name,bool is_interface)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  string *psStack_20;
  bool is_interface_local;
  string *file_name_local;
  string *path_local;
  
  local_21 = is_interface;
  psStack_20 = file_name;
  file_name_local = path;
  path_local = __return_storage_ptr__;
  if (is_interface) {
    std::operator+(&local_48,path,file_name);
    std::operator+(__return_storage_ptr__,&local_48,"_grpc.d.ts");
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    std::operator+(&local_78,path,file_name);
    std::operator+(__return_storage_ptr__,&local_78,"_grpc.js");
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GeneratedFileName(const std::string &path,
                                       const std::string &file_name,
                                       const bool is_interface = false) {
    if (is_interface) return path + file_name + "_grpc.d.ts";
    return path + file_name + "_grpc.js";
  }